

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringBuffer.cc
# Opt level: O3

void __thiscall VectorDouble::appendValue(VectorDouble *this,double l)

{
  double *__ptr;
  ulong uVar1;
  ulong uVar2;
  
  __ptr = this->vData;
  uVar1 = this->vLength;
  if (uVar1 == this->vaLength) {
    uVar2 = uVar1 >> 3;
    if ((long)(uVar1 >> 3) < vDefaultBoost) {
      uVar2 = vDefaultBoost;
    }
    this->vaLength = uVar2 + uVar1;
    __ptr = (double *)realloc(__ptr,(uVar2 + uVar1) * 8);
    this->vData = __ptr;
    uVar1 = this->vLength;
  }
  this->vLength = uVar1 + 1;
  __ptr[uVar1] = l;
  return;
}

Assistant:

void VectorDouble::appendValue(const double l) {
  long addThis;
  if (vLength == vaLength) {
    addThis = vaLength / 8;
    if (VectorDouble::vDefaultBoost > addThis)
      addThis = VectorDouble::vDefaultBoost;
    vaLength += addThis;
    vData = (double *)realloc(vData, sizeof(double) * vaLength);
  }
  vData[vLength++] = l;
}